

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O0

void __thiscall printable_sbo_cow::printable_sbo_cow(printable_sbo_cow *this,printable_sbo_cow *rhs)

{
  bool bVar1;
  uchar *puVar2;
  ptrdiff_t pVar3;
  handle_base *local_28;
  printable_sbo_cow *rhs_local;
  printable_sbo_cow *this_local;
  
  if (rhs->handle_ != (handle_base *)0x0) {
    bVar1 = heap_allocated(rhs->handle_,&rhs->buffer_);
    if (!bVar1) {
      puVar2 = char_ptr<std::array<unsigned_char,24ul>>(&this->buffer_);
      pVar3 = handle_offset(rhs->handle_,&rhs->buffer_);
      local_28 = handle_ptr(puVar2 + pVar3);
      goto LAB_0011630e;
    }
  }
  local_28 = rhs->handle_;
LAB_0011630e:
  this->handle_ = local_28;
  *(undefined8 *)(this->buffer_)._M_elems = *(undefined8 *)(rhs->buffer_)._M_elems;
  *(undefined8 *)((this->buffer_)._M_elems + 8) = *(undefined8 *)((rhs->buffer_)._M_elems + 8);
  *(undefined8 *)((this->buffer_)._M_elems + 0x10) = *(undefined8 *)((rhs->buffer_)._M_elems + 0x10)
  ;
  if (this->handle_ != (handle_base *)0x0) {
    (*this->handle_->_vptr_handle_base[4])();
  }
  return;
}

Assistant:

printable_sbo_cow (const printable_sbo_cow & rhs) :
        handle_ (
            !rhs.handle_ || heap_allocated(rhs.handle_, rhs.buffer_) ?
            rhs.handle_ :
            handle_ptr(
                char_ptr(&buffer_) + handle_offset(rhs.handle_, rhs.buffer_)
            )
        ),
        buffer_ (rhs.buffer_)
    {
        if (handle_)
            handle_->add_ref();
    }